

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

filename_t *
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *filename,size_t index)

{
  long in_RDX;
  string *in_RSI;
  filename_t *in_RDI;
  undefined1 in_stack_00000070 [16];
  string_view in_stack_00000080;
  filename_t ext;
  filename_t basename;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  char *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [3];
  string local_150 [32];
  string local_130 [8];
  filename_t *in_stack_fffffffffffffed8;
  undefined1 local_110 [24];
  undefined1 local_f8 [56];
  undefined8 local_c0;
  undefined1 *local_b8;
  unsigned_long *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string *local_a0;
  undefined1 *local_98;
  string *local_90;
  undefined1 local_88 [24];
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  unsigned_long *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  undefined1 *local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  undefined1 *local_10;
  char *local_8;
  
  if (in_RDX == 0) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::string(local_130);
    std::__cxx11::string::string(local_150);
    details::file_helper::split_by_extension(in_stack_fffffffffffffed8);
    __args_1 = local_1b0;
    std::tie<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffe18,__args_1);
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)__args_1,in_stack_fffffffffffffe08);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x23a719);
    local_68 = &stack0xfffffffffffffe40;
    local_70 = "{}.{}{}";
    local_18 = "{}.{}{}";
    args_1 = "{}.{}{}";
    local_10 = local_68;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::char_traits<char>::length((char_type *)0x23a77e);
    local_8 = local_70;
    local_90 = local_130;
    local_98 = local_110;
    local_a0 = local_150;
    local_60 = local_88;
    local_b0 = (unsigned_long *)args_1;
    local_58 = (unsigned_long *)args_1;
    pbStack_50 = local_a8;
    ::fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&,unsigned_long&,std::__cxx11::string&>
              (local_a8,(unsigned_long *)args_1,in_RDI);
    local_40 = &local_c0;
    local_48 = local_f8;
    local_28 = 0xd4d;
    local_c0 = 0xd4d;
    local_38 = local_48;
    local_30 = local_48;
    local_20 = local_40;
    local_b8 = local_48;
    ::fmt::v8::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_130);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename, std::size_t index)
{
    if (index == 0u)
    {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt_lib::format(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
}